

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O3

void cfd::core::ConfidentialAssetId::CheckVersion(uint8_t version)

{
  CfdException *this;
  uint in_EDI;
  uchar local_41;
  undefined1 local_40 [32];
  
  local_41 = (uchar)in_EDI;
  if ((in_EDI < 0xc) && ((0xc03U >> (in_EDI & 0x1f) & 1) != 0)) {
    return;
  }
  local_40._0_8_ = "cfdcore_elements_transaction.cpp";
  local_40._8_4_ = 0x1b5;
  local_40._16_8_ = "CheckVersion";
  logger::log<unsigned_char&>
            ((CfdSourceLocation *)local_40,kCfdLogLevelWarning,"Asset version Invalid. version={}.",
             &local_41);
  this = (CfdException *)__cxa_allocate_exception(0x30);
  local_40._0_8_ = local_40 + 0x10;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_40,"Asset version Invalid.","");
  CfdException::CfdException(this,kCfdIllegalArgumentError,(string *)local_40);
  __cxa_throw(this,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

void ConfidentialAssetId::CheckVersion(uint8_t version) {
  if ((version != 0) && (version != 1) && (version != 0x0a) &&
      (version != 0x0b)) {
    warn(CFD_LOG_SOURCE, "Asset version Invalid. version={}.", version);
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Asset version Invalid.");
  }
}